

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  PrimRefMB *pPVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  size_t itime;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  size_t sVar26;
  int iVar27;
  undefined4 uVar28;
  BufferView<embree::Vec3fa> *pBVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  unsigned_long uVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar54;
  float fVar55;
  uint uVar62;
  uint uVar63;
  Vec3fa n1;
  uint uVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar65;
  uint uVar73;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar74;
  float fVar81;
  Vec3fa n0;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [12];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar90;
  float fVar100;
  float fVar102;
  undefined1 auVar103 [12];
  float fVar111;
  Vec3ff v3;
  float fVar101;
  float fVar112;
  float fVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar110;
  float fVar114;
  undefined1 auVar116 [12];
  uint uVar127;
  vfloat4 a;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar115;
  uint uVar128;
  uint uVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar126;
  float fVar130;
  undefined1 auVar131 [12];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar136;
  float fVar137;
  float fVar145;
  float fVar149;
  vfloat4 a_1;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  uint uVar171;
  float fVar174;
  float fVar176;
  float fVar178;
  undefined1 auVar172 [16];
  uint uVar175;
  uint uVar177;
  undefined1 auVar173 [16];
  uint uVar181;
  uint uVar182;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar189;
  uint uVar190;
  float fVar193;
  uint uVar194;
  float fVar195;
  uint uVar196;
  float fVar197;
  uint uVar198;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  float local_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_348 [16];
  ulong local_338;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  size_t local_2e0;
  unsigned_long local_2d8;
  size_t local_2d0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  BBox1f local_238;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  anon_class_16_2_07cfa4d6 local_f0;
  ulong local_e0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar34 = r->_begin;
  local_238.lower = 0.0;
  local_238.upper = 1.0;
  local_2d8 = 0;
  local_338 = 0;
  local_2e0 = 0;
  fVar22 = 0.0;
  local_37c = 1.0;
  local_248._8_8_ = 0xff800000ff800000;
  local_248._0_8_ = 0xff800000ff800000;
  local_258._8_8_ = 0x7f8000007f800000;
  local_258._0_8_ = 0x7f8000007f800000;
  local_268._8_8_ = 0xff800000ff800000;
  local_268._0_8_ = 0xff800000ff800000;
  local_278._8_8_ = 0x7f8000007f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  local_298._8_8_ = 0xff800000ff800000;
  local_298._0_8_ = 0xff800000ff800000;
  local_2a8._8_8_ = 0x7f8000007f800000;
  local_2a8._0_8_ = 0x7f8000007f800000;
  local_2d0 = k;
  while( true ) {
    if (r->_end <= uVar34) {
      (__return_storage_ptr__->object_range)._end = local_2d8;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_2a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_2a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_298._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_298._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_278._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_278._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_268._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_268._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_258._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_258._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_248._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_248._8_8_;
      (__return_storage_ptr__->time_range).lower = local_37c;
      (__return_storage_ptr__->time_range).upper = fVar22;
      __return_storage_ptr__->num_time_segments = local_2e0;
      __return_storage_ptr__->max_num_time_segments = local_338;
      __return_storage_ptr__->max_time_range = local_238;
      return __return_storage_ptr__;
    }
    BVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    fVar102 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
              super_Geometry.fnumTimeSegments;
    fVar37 = t0t1->lower;
    fVar38 = t0t1->upper;
    fVar55 = BVar3.lower;
    fVar74 = BVar3.upper - fVar55;
    fVar36 = ceilf(((fVar38 - fVar55) / fVar74) * 0.99999976 * fVar102);
    uVar65 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.field_0x68 * uVar34);
    uVar24 = (ulong)(uVar65 + 3);
    pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    if (uVar24 < (pBVar4->super_RawBufferView).num) break;
LAB_00200326:
    uVar34 = uVar34 + 1;
  }
  if (fVar102 <= fVar36) {
    fVar36 = fVar102;
  }
  fVar74 = floorf(((fVar37 - fVar55) / fVar74) * 1.0000002 * fVar102);
  fVar55 = 0.0;
  if (0.0 <= fVar74) {
    fVar55 = fVar74;
  }
  uVar23 = (ulong)(int)fVar55;
  pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.normals.
           items;
  fVar55 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar29 = pBVar5;
LAB_001ff308:
  if ((ulong)(long)(int)fVar36 < uVar23) {
    local_f0.primID = &local_e0;
    fVar36 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
             super_Geometry.time_range.lower;
    fVar55 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
             super_Geometry.time_range.upper - fVar36;
    fVar74 = (fVar37 - fVar36) / fVar55;
    fVar55 = (fVar38 - fVar36) / fVar55;
    fVar36 = fVar102 * fVar55;
    local_f0.this = this;
    local_e0 = uVar34;
    fVar37 = floorf(fVar102 * fVar74);
    fVar38 = ceilf(fVar36);
    iVar27 = (int)fVar37;
    if (fVar37 <= 0.0) {
      fVar37 = 0.0;
    }
    fVar93 = fVar38;
    if (fVar102 <= fVar38) {
      fVar93 = fVar102;
    }
    iVar25 = -1;
    if (-1 < iVar27) {
      iVar25 = iVar27;
    }
    iVar8 = (int)fVar102 + 1;
    if ((int)fVar38 < (int)fVar102 + 1) {
      iVar8 = (int)fVar38;
    }
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_f0,(long)(int)fVar37);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_f0,(long)(int)fVar93);
    fVar38 = fVar102 * fVar74 - fVar37;
    if (iVar8 - iVar25 == 1) {
      if (fVar38 <= 0.0) {
        fVar38 = 0.0;
      }
      fVar102 = 1.0 - fVar38;
      auVar116._0_4_ =
           fVar102 * blower0.lower.field_0.m128[0] + fVar38 * bupper1.lower.field_0.m128[0];
      auVar116._4_4_ =
           fVar102 * blower0.lower.field_0.m128[1] + fVar38 * bupper1.lower.field_0.m128[1];
      auVar116._8_4_ =
           fVar102 * blower0.lower.field_0.m128[2] + fVar38 * bupper1.lower.field_0.m128[2];
      auVar103._0_4_ =
           fVar102 * blower0.upper.field_0.m128[0] + fVar38 * bupper1.upper.field_0.m128[0];
      auVar103._4_4_ =
           fVar102 * blower0.upper.field_0.m128[1] + fVar38 * bupper1.upper.field_0.m128[1];
      auVar103._8_4_ =
           fVar102 * blower0.upper.field_0.m128[2] + fVar38 * bupper1.upper.field_0.m128[2];
      fVar102 = fVar93 - fVar36;
      if (fVar93 - fVar36 <= 0.0) {
        fVar102 = 0.0;
      }
      fVar37 = 1.0 - fVar102;
      auVar131._0_4_ =
           bupper1.lower.field_0.m128[0] * fVar37 + blower0.lower.field_0.m128[0] * fVar102;
      auVar131._4_4_ =
           bupper1.lower.field_0.m128[1] * fVar37 + blower0.lower.field_0.m128[1] * fVar102;
      auVar131._8_4_ =
           bupper1.lower.field_0.m128[2] * fVar37 + blower0.lower.field_0.m128[2] * fVar102;
      auVar85._0_4_ =
           fVar37 * bupper1.upper.field_0.m128[0] + fVar102 * blower0.upper.field_0.m128[0];
      auVar85._4_4_ =
           fVar37 * bupper1.upper.field_0.m128[1] + fVar102 * blower0.upper.field_0.m128[1];
      auVar85._8_4_ =
           fVar37 * bupper1.upper.field_0.m128[2] + fVar102 * blower0.upper.field_0.m128[2];
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_f0,(long)((int)fVar37 + 1))
      ;
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_f0,(long)((int)fVar93 + -1));
      if (fVar38 <= 0.0) {
        fVar38 = 0.0;
      }
      fVar37 = 1.0 - fVar38;
      auVar157._0_4_ =
           blower0.lower.field_0.m128[0] * fVar37 + blower1.lower.field_0.m128[0] * fVar38;
      auVar157._4_4_ =
           blower0.lower.field_0.m128[1] * fVar37 + blower1.lower.field_0.m128[1] * fVar38;
      auVar157._8_4_ =
           blower0.lower.field_0.m128[2] * fVar37 + blower1.lower.field_0.m128[2] * fVar38;
      auVar157._12_4_ =
           blower0.lower.field_0.m128[3] * fVar37 + blower1.lower.field_0.m128[3] * fVar38;
      auVar118._0_4_ =
           fVar37 * blower0.upper.field_0.m128[0] + fVar38 * blower1.upper.field_0.m128[0];
      auVar118._4_4_ =
           fVar37 * blower0.upper.field_0.m128[1] + fVar38 * blower1.upper.field_0.m128[1];
      auVar118._8_4_ =
           fVar37 * blower0.upper.field_0.m128[2] + fVar38 * blower1.upper.field_0.m128[2];
      auVar118._12_4_ =
           fVar37 * blower0.upper.field_0.m128[3] + fVar38 * blower1.upper.field_0.m128[3];
      fVar37 = fVar93 - fVar36;
      if (fVar93 - fVar36 <= 0.0) {
        fVar37 = 0.0;
      }
      fVar38 = 1.0 - fVar37;
      auVar105._0_4_ =
           bupper1.lower.field_0.m128[0] * fVar38 + bupper0.lower.field_0.m128[0] * fVar37;
      auVar105._4_4_ =
           bupper1.lower.field_0.m128[1] * fVar38 + bupper0.lower.field_0.m128[1] * fVar37;
      auVar105._8_4_ =
           bupper1.lower.field_0.m128[2] * fVar38 + bupper0.lower.field_0.m128[2] * fVar37;
      auVar105._12_4_ =
           bupper1.lower.field_0.m128[3] * fVar38 + bupper0.lower.field_0.m128[3] * fVar37;
      auVar104._0_4_ =
           fVar38 * bupper1.upper.field_0.m128[0] + fVar37 * bupper0.upper.field_0.m128[0];
      auVar104._4_4_ =
           fVar38 * bupper1.upper.field_0.m128[1] + fVar37 * bupper0.upper.field_0.m128[1];
      auVar104._8_4_ =
           fVar38 * bupper1.upper.field_0.m128[2] + fVar37 * bupper0.upper.field_0.m128[2];
      auVar104._12_4_ =
           fVar38 * bupper1.upper.field_0.m128[3] + fVar37 * bupper0.upper.field_0.m128[3];
      if (iVar27 < 0) {
        iVar27 = -1;
      }
      sVar26 = (size_t)iVar27;
      while( true ) {
        auVar85 = auVar104._0_12_;
        auVar131 = auVar105._0_12_;
        auVar103 = auVar118._0_12_;
        auVar116 = auVar157._0_12_;
        sVar26 = sVar26 + 1;
        if ((long)iVar8 <= (long)sVar26) break;
        fVar37 = ((float)(int)sVar26 / fVar102 - fVar74) / (fVar55 - fVar74);
        fVar97 = 1.0 - fVar37;
        fVar38 = auVar105._4_4_;
        fVar36 = auVar105._8_4_;
        fVar93 = auVar105._12_4_;
        fVar114 = auVar157._4_4_;
        fVar81 = auVar157._8_4_;
        fVar82 = auVar157._12_4_;
        fVar94 = auVar104._4_4_;
        fVar98 = auVar104._8_4_;
        fVar155 = auVar104._12_4_;
        fVar160 = auVar118._4_4_;
        fVar162 = auVar118._8_4_;
        fVar183 = auVar118._12_4_;
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_f0,sVar26);
        auVar120._0_4_ =
             bi.lower.field_0.m128[0] - (auVar157._0_4_ * fVar97 + auVar105._0_4_ * fVar37);
        auVar120._4_4_ = bi.lower.field_0.m128[1] - (fVar114 * fVar97 + fVar38 * fVar37);
        auVar120._8_4_ = bi.lower.field_0.m128[2] - (fVar81 * fVar97 + fVar36 * fVar37);
        auVar120._12_4_ = bi.lower.field_0.m128[3] - (fVar82 * fVar97 + fVar93 * fVar37);
        auVar184._0_4_ =
             bi.upper.field_0.m128[0] - (fVar97 * auVar118._0_4_ + fVar37 * auVar104._0_4_);
        auVar184._4_4_ = bi.upper.field_0.m128[1] - (fVar97 * fVar160 + fVar37 * fVar94);
        auVar184._8_4_ = bi.upper.field_0.m128[2] - (fVar97 * fVar162 + fVar37 * fVar98);
        auVar184._12_4_ = bi.upper.field_0.m128[3] - (fVar97 * fVar183 + fVar37 * fVar155);
        auVar120 = minps(auVar120,ZEXT816(0));
        auVar184 = maxps(auVar184,ZEXT816(0));
        auVar157._0_4_ = auVar157._0_4_ + auVar120._0_4_;
        auVar157._4_4_ = fVar114 + auVar120._4_4_;
        auVar157._8_4_ = fVar81 + auVar120._8_4_;
        auVar157._12_4_ = fVar82 + auVar120._12_4_;
        auVar105._0_4_ = auVar105._0_4_ + auVar120._0_4_;
        auVar105._4_4_ = fVar38 + auVar120._4_4_;
        auVar105._8_4_ = fVar36 + auVar120._8_4_;
        auVar105._12_4_ = fVar93 + auVar120._12_4_;
        auVar118._0_4_ = auVar118._0_4_ + auVar184._0_4_;
        auVar118._4_4_ = fVar160 + auVar184._4_4_;
        auVar118._8_4_ = fVar162 + auVar184._8_4_;
        auVar118._12_4_ = fVar183 + auVar184._12_4_;
        auVar104._0_4_ = auVar104._0_4_ + auVar184._0_4_;
        auVar104._4_4_ = fVar94 + auVar184._4_4_;
        auVar104._8_4_ = fVar98 + auVar184._8_4_;
        auVar104._12_4_ = fVar155 + auVar184._12_4_;
      }
    }
    fVar102 = (float)((this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry
                      .super_Geometry.numTimeSteps - 1);
    uVar24 = (ulong)(uint)fVar102;
    aVar126.m128[3] = (float)geomID;
    aVar126._0_12_ = auVar116;
    aVar110.m128[3] = (float)uVar34;
    aVar110._0_12_ = auVar103;
    aVar136.m128[3] = fVar102;
    aVar136._0_12_ = auVar131;
    aVar90.m128[3] = fVar102;
    aVar90._0_12_ = auVar85;
    auVar191._0_4_ =
         auVar103._0_4_ * 0.5 + auVar85._0_4_ * 0.5 + auVar116._0_4_ * 0.5 + auVar131._0_4_ * 0.5;
    auVar191._4_4_ =
         auVar103._4_4_ * 0.5 + auVar85._4_4_ * 0.5 + auVar116._4_4_ * 0.5 + auVar131._4_4_ * 0.5;
    auVar191._8_4_ =
         auVar103._8_4_ * 0.5 + auVar85._8_4_ * 0.5 + auVar116._8_4_ * 0.5 + auVar131._8_4_ * 0.5;
    auVar191._12_4_ = (float)uVar34 * 0.5 + fVar102 * 0.5 + (float)geomID * 0.5 + fVar102 * 0.5;
    BVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    local_2a8 = minps(local_2a8,(undefined1  [16])aVar126);
    local_2d8 = local_2d8 + 1;
    local_2e0 = local_2e0 + uVar24;
    bVar35 = local_338 < uVar24;
    if (local_338 <= uVar24) {
      local_338 = uVar24;
    }
    pPVar7 = prims->items;
    pPVar7[local_2d0].lbounds.bounds0.lower.field_0 = aVar126;
    local_298 = maxps(local_298,(undefined1  [16])aVar110);
    pPVar7[local_2d0].lbounds.bounds0.upper.field_0 = aVar110;
    local_278 = minps(local_278,(undefined1  [16])aVar136);
    pPVar7[local_2d0].lbounds.bounds1.lower.field_0 = aVar136;
    local_268 = maxps(local_268,(undefined1  [16])aVar90);
    pPVar7[local_2d0].lbounds.bounds1.upper.field_0 = aVar90;
    pPVar7[local_2d0].time_range = BVar3;
    local_258 = minps(local_258,auVar191);
    local_248 = maxps(local_248,auVar191);
    fVar102 = BVar3.lower;
    if (fVar102 <= local_37c) {
      local_37c = fVar102;
    }
    fVar38 = BVar3.upper;
    fVar37 = fVar38;
    if (fVar38 <= fVar22) {
      fVar37 = fVar22;
    }
    uVar65 = (int)((uint)bVar35 << 0x1f) >> 0x1f;
    uVar73 = (int)((uint)bVar35 << 0x1f) >> 0x1f;
    local_2d0 = local_2d0 + 1;
    local_238.upper = (float)(~uVar73 & (uint)local_238.upper | (uint)fVar38 & uVar73);
    local_238.lower = (float)(~uVar65 & (uint)local_238.lower | (uint)fVar102 & uVar65);
    fVar22 = fVar37;
  }
  else {
    pcVar6 = pBVar4[uVar23].super_RawBufferView.ptr_ofs;
    sVar26 = pBVar4[uVar23].super_RawBufferView.stride;
    lVar33 = sVar26 * uVar65;
    lVar32 = sVar26 * (uVar65 + 1);
    lVar31 = sVar26 * (uVar65 + 2);
    auVar144._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar32 + 0xc)));
    auVar144._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar33 + 0xc)));
    auVar144._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar31 + 0xc)));
    auVar144._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + sVar26 * uVar24 + 0xc)));
    iVar27 = movmskps((int)pBVar29,auVar144);
    if (iVar27 == 0) {
      pfVar1 = (float *)(pcVar6 + lVar33);
      fVar74 = *pfVar1;
      fVar93 = pfVar1[1];
      fVar97 = pfVar1[2];
      fVar114 = pfVar1[3];
      fVar81 = (float)DAT_01f4a960;
      fVar82 = DAT_01f4a960._4_4_;
      fVar94 = DAT_01f4a960._8_4_;
      fVar98 = DAT_01f4a960._12_4_;
      auVar165._0_4_ = -(uint)(fVar74 < 1.844e+18 && fVar81 < fVar74);
      auVar165._4_4_ = -(uint)(fVar93 < 1.844e+18 && fVar82 < fVar93);
      auVar165._8_4_ = -(uint)(fVar97 < 1.844e+18 && fVar94 < fVar97);
      auVar165._12_4_ = -(uint)(fVar114 < 1.844e+18 && fVar98 < fVar114);
      uVar28 = movmskps(0,auVar165);
      if ((~(byte)uVar28 & 7) == 0) {
        pfVar1 = (float *)(pcVar6 + lVar32);
        fVar155 = *pfVar1;
        fVar160 = pfVar1[1];
        fVar162 = pfVar1[2];
        fVar183 = pfVar1[3];
        auVar180._0_4_ = -(uint)(fVar155 < 1.844e+18 && fVar81 < fVar155);
        auVar180._4_4_ = -(uint)(fVar160 < 1.844e+18 && fVar82 < fVar160);
        auVar180._8_4_ = -(uint)(fVar162 < 1.844e+18 && fVar94 < fVar162);
        auVar180._12_4_ = -(uint)(fVar183 < 1.844e+18 && fVar98 < fVar183);
        uVar28 = movmskps(CONCAT31((int3)((uint)uVar28 >> 8),~(byte)uVar28),auVar180);
        if ((~(byte)uVar28 & 7) == 0) {
          auVar118 = *(undefined1 (*) [16])(pcVar6 + lVar31);
          fVar83 = auVar118._0_4_;
          fVar91 = auVar118._4_4_;
          fVar95 = auVar118._8_4_;
          fVar99 = auVar118._12_4_;
          auVar75._0_4_ = -(uint)(fVar83 < 1.844e+18 && fVar81 < fVar83);
          auVar75._4_4_ = -(uint)(fVar91 < 1.844e+18 && fVar82 < fVar91);
          auVar75._8_4_ = -(uint)(fVar95 < 1.844e+18 && fVar94 < fVar95);
          auVar75._12_4_ = -(uint)(fVar99 < 1.844e+18 && fVar98 < fVar99);
          uVar28 = movmskps(CONCAT31((int3)((uint)uVar28 >> 8),~(byte)uVar28),auVar75);
          if ((~(byte)uVar28 & 7) == 0) {
            auVar118 = *(undefined1 (*) [16])(pcVar6 + sVar26 * uVar24);
            fVar100 = auVar118._0_4_;
            fVar111 = auVar118._4_4_;
            fVar112 = auVar118._8_4_;
            fVar113 = auVar118._12_4_;
            auVar76._0_4_ = -(uint)(fVar100 < 1.844e+18 && fVar81 < fVar100);
            auVar76._4_4_ = -(uint)(fVar111 < 1.844e+18 && fVar82 < fVar111);
            auVar76._8_4_ = -(uint)(fVar112 < 1.844e+18 && fVar94 < fVar112);
            auVar76._12_4_ = -(uint)(fVar113 < 1.844e+18 && fVar98 < fVar113);
            uVar28 = movmskps(CONCAT31((int3)((uint)uVar28 >> 8),~(byte)uVar28),auVar76);
            if ((~(byte)uVar28 & 7) == 0) {
              pcVar6 = pBVar5[uVar23].super_RawBufferView.ptr_ofs;
              sVar26 = pBVar5[uVar23].super_RawBufferView.stride;
              lVar31 = sVar26 * uVar65;
              pfVar1 = (float *)(pcVar6 + lVar31);
              fVar130 = *pfVar1;
              fVar148 = pfVar1[1];
              fVar152 = pfVar1[2];
              auVar117._0_4_ = -(uint)(fVar130 < 1.844e+18 && fVar81 < fVar130);
              auVar117._4_4_ = -(uint)(fVar148 < 1.844e+18 && fVar82 < fVar148);
              auVar117._8_4_ = -(uint)(fVar152 < 1.844e+18 && fVar94 < fVar152);
              auVar117._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && fVar98 < pfVar1[3]);
              uVar28 = movmskps((int)lVar31,auVar117);
              if ((~(byte)uVar28 & 7) == 0) {
                lVar31 = sVar26 * (uVar65 + 1);
                pfVar1 = (float *)(pcVar6 + lVar31);
                fVar186 = *pfVar1;
                fVar187 = pfVar1[1];
                fVar101 = pfVar1[2];
                auVar132._0_4_ = -(uint)(fVar186 < 1.844e+18 && fVar81 < fVar186);
                auVar132._4_4_ = -(uint)(fVar187 < 1.844e+18 && fVar82 < fVar187);
                auVar132._8_4_ = -(uint)(fVar101 < 1.844e+18 && fVar94 < fVar101);
                auVar132._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && fVar98 < pfVar1[3]);
                uVar28 = movmskps((int)lVar31,auVar132);
                if ((~(byte)uVar28 & 7) == 0) goto code_r0x001ff481;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00200326;
code_r0x001ff481:
  fVar114 = fVar114 * fVar55;
  fVar113 = fVar113 * fVar55;
  lVar31 = sVar26 * (uVar65 + 2);
  pfVar1 = (float *)(pcVar6 + lVar31);
  pfVar2 = (float *)(pcVar6 + sVar26 * uVar24);
  fVar140 = *pfVar2;
  fVar141 = pfVar2[1];
  fVar156 = pfVar2[2];
  fVar188 = fVar99 * fVar55 * 0.0;
  fVar137 = fVar100 * 0.0 + fVar83 * 0.0;
  fVar145 = fVar111 * 0.0 + fVar91 * 0.0;
  fVar149 = fVar112 * 0.0 + fVar95 * 0.0;
  fVar153 = fVar113 * 0.0 + fVar188;
  fVar154 = fVar155 * 0.0;
  fVar159 = fVar160 * 0.0;
  fVar161 = fVar162 * 0.0;
  fVar163 = fVar183 * fVar55 * 0.0;
  fVar189 = fVar154 + fVar137 + fVar74;
  fVar193 = fVar159 + fVar145 + fVar93;
  fVar195 = fVar161 + fVar149 + fVar97;
  fVar197 = fVar163 + fVar153 + fVar114;
  fVar137 = (fVar155 * 3.0 + fVar137) - fVar74 * 3.0;
  fVar145 = (fVar160 * 3.0 + fVar145) - fVar93 * 3.0;
  fVar149 = (fVar162 * 3.0 + fVar149) - fVar97 * 3.0;
  fVar153 = (fVar183 * fVar55 * 3.0 + fVar153) - fVar114 * 3.0;
  fVar84 = *pfVar1 * 0.0;
  fVar92 = pfVar1[1] * 0.0;
  fVar96 = pfVar1[2] * 0.0;
  fVar155 = fVar140 * 0.0 + fVar84;
  fVar160 = fVar141 * 0.0 + fVar92;
  fVar162 = fVar156 * 0.0 + fVar96;
  fVar138 = fVar186 * 0.0;
  fVar146 = fVar187 * 0.0;
  fVar150 = fVar101 * 0.0;
  fVar139 = fVar138 + fVar155 + fVar130;
  fVar147 = fVar146 + fVar160 + fVar148;
  fVar151 = fVar150 + fVar162 + fVar152;
  fVar155 = (fVar186 * 3.0 + fVar155) - fVar130 * 3.0;
  fVar160 = (fVar187 * 3.0 + fVar160) - fVar148 * 3.0;
  fVar162 = (fVar101 * 3.0 + fVar162) - fVar152 * 3.0;
  fVar183 = fVar83 * 0.0 + fVar100 + fVar154 + fVar74 * 0.0;
  fVar186 = fVar91 * 0.0 + fVar111 + fVar159 + fVar93 * 0.0;
  fVar187 = fVar95 * 0.0 + fVar112 + fVar161 + fVar97 * 0.0;
  fVar188 = fVar188 + fVar113 + fVar163 + fVar114 * 0.0;
  fVar101 = ((fVar100 * 3.0 - fVar83 * 3.0) + fVar154) - fVar74 * 0.0;
  fVar154 = ((fVar111 * 3.0 - fVar91 * 3.0) + fVar159) - fVar93 * 0.0;
  fVar159 = ((fVar112 * 3.0 - fVar95 * 3.0) + fVar161) - fVar97 * 0.0;
  fVar161 = ((fVar113 * 3.0 - fVar99 * fVar55 * 3.0) + fVar163) - fVar114 * 0.0;
  fVar74 = fVar84 + fVar140 + fVar138 + fVar130 * 0.0;
  fVar93 = fVar92 + fVar141 + fVar146 + fVar148 * 0.0;
  fVar97 = fVar96 + fVar156 + fVar150 + fVar152 * 0.0;
  fVar114 = ((fVar140 * 3.0 - *pfVar1 * 3.0) + fVar138) - fVar130 * 0.0;
  fVar95 = ((fVar141 * 3.0 - pfVar1[1] * 3.0) + fVar146) - fVar148 * 0.0;
  fVar99 = ((fVar156 * 3.0 - pfVar1[2] * 3.0) + fVar150) - fVar152 * 0.0;
  fVar140 = fVar139 * fVar145 - fVar147 * fVar137;
  fVar148 = fVar147 * fVar149 - fVar151 * fVar145;
  fVar152 = fVar151 * fVar137 - fVar139 * fVar149;
  fVar83 = fVar145 * fVar155 - fVar160 * fVar137;
  fVar160 = fVar149 * fVar160 - fVar162 * fVar145;
  fVar162 = fVar137 * fVar162 - fVar155 * fVar149;
  fVar91 = fVar74 * fVar154 - fVar93 * fVar101;
  fVar100 = fVar93 * fVar159 - fVar97 * fVar154;
  fVar112 = fVar97 * fVar101 - fVar74 * fVar159;
  fVar74 = fVar154 * fVar114 - fVar95 * fVar101;
  fVar97 = fVar159 * fVar95 - fVar99 * fVar154;
  fVar114 = fVar101 * fVar99 - fVar114 * fVar159;
  fVar156 = fVar152 * fVar152 + fVar148 * fVar148 + fVar140 * fVar140;
  auVar157 = ZEXT416((uint)fVar156);
  auVar118 = rsqrtss(ZEXT416((uint)fVar156),auVar157);
  fVar93 = auVar118._0_4_;
  fVar141 = fVar93 * 1.5 - fVar93 * fVar93 * fVar156 * 0.5 * fVar93;
  fVar92 = fVar140 * fVar83 + fVar152 * fVar162 + fVar148 * fVar160;
  auVar118 = rcpss(auVar157,auVar157);
  fVar155 = (2.0 - fVar156 * auVar118._0_4_) * auVar118._0_4_;
  fVar130 = fVar112 * fVar112 + fVar100 * fVar100 + fVar91 * fVar91;
  auVar118 = ZEXT416((uint)fVar130);
  auVar157 = rsqrtss(ZEXT416((uint)fVar130),auVar118);
  fVar93 = auVar157._0_4_;
  fVar95 = fVar93 * 1.5 - fVar93 * fVar93 * fVar130 * 0.5 * fVar93;
  fVar84 = fVar91 * fVar74 + fVar112 * fVar114 + fVar100 * fVar97;
  auVar118 = rcpss(auVar118,auVar118);
  fVar93 = (2.0 - fVar130 * auVar118._0_4_) * auVar118._0_4_;
  fVar99 = fVar197 * fVar148 * fVar141;
  fVar111 = fVar197 * fVar152 * fVar141;
  fVar113 = fVar197 * fVar140 * fVar141;
  fVar96 = fVar189 - fVar99;
  fVar138 = fVar193 - fVar111;
  fVar139 = fVar195 - fVar113;
  fVar148 = fVar197 * fVar155 * (fVar156 * fVar160 - fVar92 * fVar148) * fVar141 +
            fVar153 * fVar148 * fVar141;
  fVar152 = fVar197 * fVar155 * (fVar156 * fVar162 - fVar92 * fVar152) * fVar141 +
            fVar153 * fVar152 * fVar141;
  fVar140 = fVar197 * fVar155 * (fVar156 * fVar83 - fVar92 * fVar140) * fVar141 +
            fVar153 * fVar140 * fVar141;
  fVar155 = fVar188 * fVar100 * fVar95;
  fVar160 = fVar188 * fVar112 * fVar95;
  fVar162 = fVar188 * fVar91 * fVar95;
  fVar141 = fVar183 - fVar155;
  fVar156 = fVar186 - fVar160;
  fVar153 = fVar187 - fVar162;
  fVar83 = fVar188 * fVar93 * (fVar130 * fVar97 - fVar84 * fVar100) * fVar95 +
           fVar161 * fVar100 * fVar95;
  fVar114 = fVar188 * fVar93 * (fVar130 * fVar114 - fVar84 * fVar112) * fVar95 +
            fVar161 * fVar112 * fVar95;
  fVar91 = fVar188 * fVar93 * (fVar130 * fVar74 - fVar84 * fVar91) * fVar95 +
           fVar161 * fVar91 * fVar95;
  fVar95 = (fVar137 - fVar148) * 0.33333334 + fVar96;
  fVar100 = (fVar145 - fVar152) * 0.33333334 + fVar138;
  fVar112 = (fVar149 - fVar140) * 0.33333334 + fVar139;
  fVar74 = fVar141 - (fVar101 - fVar83) * 0.33333334;
  fVar93 = fVar156 - (fVar154 - fVar114) * 0.33333334;
  fVar97 = fVar153 - (fVar159 - fVar91) * 0.33333334;
  uVar30 = 0;
  local_348._8_8_ = 0xff800000ff800000;
  local_348._0_8_ = 0xff800000ff800000;
  local_358 = 0xff800000;
  uStack_354 = 0xff800000;
  uStack_350 = 0xff800000;
  uStack_34c = 0xff800000;
  local_378._8_8_ = 0xff800000ff800000;
  local_378._0_8_ = 0xff800000ff800000;
  local_398._8_8_ = 0x7f8000007f800000;
  local_398._0_8_ = 0x7f8000007f800000;
  local_328 = 0x7f800000;
  uStack_324 = 0x7f800000;
  uStack_320 = 0x7f800000;
  uStack_31c = 0x7f800000;
  local_318 = 0x7f800000;
  uStack_314 = 0x7f800000;
  uStack_310 = 0x7f800000;
  uStack_30c = 0x7f800000;
  while( true ) {
    uVar73 = local_378._0_4_;
    uVar181 = local_378._8_4_;
    uVar182 = local_378._12_4_;
    if (7 < uVar30) break;
    uVar198 = (uint)uVar30;
    uVar54 = -(uint)(-0x7ffffff9 < (int)(uVar198 ^ 0x80000000));
    uVar62 = -(uint)(-0x7ffffff9 < (int)(uVar198 ^ 0x80000000));
    uVar63 = -(uint)(-0x7ffffff9 < (int)(uVar198 ^ 0x80000000));
    uVar64 = -(uint)(-0x7ffffff9 < (int)(uVar198 ^ 0x80000000));
    lVar32 = uVar30 * 4;
    fVar130 = *(float *)(bezier_basis0 + lVar32 + 0x1dc);
    fVar84 = *(float *)(bezier_basis0 + lVar32 + 0x1e0);
    fVar92 = *(float *)(bezier_basis0 + lVar32 + 0x1e4);
    fVar161 = *(float *)(bezier_basis0 + lVar32 + 0x1e8);
    lVar32 = uVar30 * 4;
    fVar146 = *(float *)(bezier_basis0 + lVar32 + 0x660);
    fVar147 = *(float *)(bezier_basis0 + lVar32 + 0x664);
    fVar150 = *(float *)(bezier_basis0 + lVar32 + 0x668);
    fVar151 = *(float *)(bezier_basis0 + lVar32 + 0x66c);
    lVar32 = uVar30 * 4;
    fVar163 = *(float *)(bezier_basis0 + lVar32 + 0xae4);
    fVar188 = *(float *)(bezier_basis0 + lVar32 + 0xae8);
    fVar197 = *(float *)(bezier_basis0 + lVar32 + 0xaec);
    fVar9 = *(float *)(bezier_basis0 + lVar32 + 0xaf0);
    lVar32 = uVar30 * 4;
    fVar10 = *(float *)(bezier_basis0 + lVar32 + 0xf68);
    fVar11 = *(float *)(bezier_basis0 + lVar32 + 0xf6c);
    fVar12 = *(float *)(bezier_basis0 + lVar32 + 0xf70);
    fVar13 = *(float *)(bezier_basis0 + lVar32 + 0xf74);
    auVar77._0_4_ = fVar96 * fVar130 + fVar95 * fVar146 + fVar74 * fVar163 + fVar141 * fVar10;
    auVar77._4_4_ = fVar96 * fVar84 + fVar95 * fVar147 + fVar74 * fVar188 + fVar141 * fVar11;
    auVar77._8_4_ = fVar96 * fVar92 + fVar95 * fVar150 + fVar74 * fVar197 + fVar141 * fVar12;
    auVar77._12_4_ = fVar96 * fVar161 + fVar95 * fVar151 + fVar74 * fVar9 + fVar141 * fVar13;
    auVar142._0_4_ = fVar138 * fVar130 + fVar100 * fVar146 + fVar93 * fVar163 + fVar156 * fVar10;
    auVar142._4_4_ = fVar138 * fVar84 + fVar100 * fVar147 + fVar93 * fVar188 + fVar156 * fVar11;
    auVar142._8_4_ = fVar138 * fVar92 + fVar100 * fVar150 + fVar93 * fVar197 + fVar156 * fVar12;
    auVar142._12_4_ = fVar138 * fVar161 + fVar100 * fVar151 + fVar93 * fVar9 + fVar156 * fVar13;
    auVar86._0_4_ = fVar130 * fVar139 + fVar146 * fVar112 + fVar163 * fVar97 + fVar10 * fVar153;
    auVar86._4_4_ = fVar84 * fVar139 + fVar147 * fVar112 + fVar188 * fVar97 + fVar11 * fVar153;
    auVar86._8_4_ = fVar92 * fVar139 + fVar150 * fVar112 + fVar197 * fVar97 + fVar12 * fVar153;
    auVar86._12_4_ = fVar161 * fVar139 + fVar151 * fVar112 + fVar9 * fVar97 + fVar13 * fVar153;
    lVar32 = uVar30 * 4;
    fVar130 = *(float *)(bezier_basis0 + lVar32 + 0x13ec);
    fVar84 = *(float *)(bezier_basis0 + lVar32 + 0x13f0);
    fVar92 = *(float *)(bezier_basis0 + lVar32 + 0x13f4);
    fVar161 = *(float *)(bezier_basis0 + lVar32 + 0x13f8);
    lVar32 = uVar30 * 4;
    fVar146 = *(float *)(bezier_basis0 + lVar32 + 0x1870);
    fVar147 = *(float *)(bezier_basis0 + lVar32 + 0x1874);
    fVar150 = *(float *)(bezier_basis0 + lVar32 + 0x1878);
    fVar151 = *(float *)(bezier_basis0 + lVar32 + 0x187c);
    lVar32 = uVar30 * 4;
    fVar163 = *(float *)(bezier_basis0 + lVar32 + 0x1cf4);
    fVar188 = *(float *)(bezier_basis0 + lVar32 + 0x1cf8);
    fVar197 = *(float *)(bezier_basis0 + lVar32 + 0x1cfc);
    fVar9 = *(float *)(bezier_basis0 + lVar32 + 0x1d00);
    lVar32 = uVar30 * 4;
    fVar10 = *(float *)(bezier_basis0 + lVar32 + 0x2178);
    fVar11 = *(float *)(bezier_basis0 + lVar32 + 0x217c);
    fVar12 = *(float *)(bezier_basis0 + lVar32 + 0x2180);
    fVar13 = *(float *)(bezier_basis0 + lVar32 + 0x2184);
    fVar170 = fVar96 * fVar130 + fVar95 * fVar146 + fVar74 * fVar163 + fVar141 * fVar10;
    fVar174 = fVar96 * fVar84 + fVar95 * fVar147 + fVar74 * fVar188 + fVar141 * fVar11;
    fVar176 = fVar96 * fVar92 + fVar95 * fVar150 + fVar74 * fVar197 + fVar141 * fVar12;
    fVar178 = fVar96 * fVar161 + fVar95 * fVar151 + fVar74 * fVar9 + fVar141 * fVar13;
    fVar166 = fVar138 * fVar130 + fVar100 * fVar146 + fVar93 * fVar163 + fVar156 * fVar10;
    fVar167 = fVar138 * fVar84 + fVar100 * fVar147 + fVar93 * fVar188 + fVar156 * fVar11;
    fVar168 = fVar138 * fVar92 + fVar100 * fVar150 + fVar93 * fVar197 + fVar156 * fVar12;
    fVar169 = fVar138 * fVar161 + fVar100 * fVar151 + fVar93 * fVar9 + fVar156 * fVar13;
    fVar130 = fVar130 * fVar139 + fVar146 * fVar112 + fVar163 * fVar97 + fVar10 * fVar153;
    fVar84 = fVar84 * fVar139 + fVar147 * fVar112 + fVar188 * fVar97 + fVar11 * fVar153;
    fVar92 = fVar92 * fVar139 + fVar150 * fVar112 + fVar197 * fVar97 + fVar12 * fVar153;
    fVar161 = fVar161 * fVar139 + fVar151 * fVar112 + fVar9 * fVar97 + fVar13 * fVar153;
    uVar115 = -(uint)(uVar198 == 0);
    uVar127 = -(uint)(uVar198 == 1);
    uVar128 = -(uint)(uVar198 == 2);
    uVar129 = -(uint)(uVar198 == 3);
    uVar190 = -(uint)(uVar198 == 7);
    uVar194 = -(uint)(uVar198 == 6);
    uVar196 = -(uint)(uVar198 == 5);
    uVar198 = -(uint)(uVar198 == 4);
    local_368._4_4_ = (float)(~uVar194 & (uint)fVar174) * 0.055555556 + auVar77._4_4_;
    local_368._0_4_ = (float)(~uVar190 & (uint)fVar170) * 0.055555556 + auVar77._0_4_;
    fStack_360 = (float)(~uVar196 & (uint)fVar176) * 0.055555556 + auVar77._8_4_;
    fStack_35c = (float)(~uVar198 & (uint)fVar178) * 0.055555556 + auVar77._12_4_;
    auVar118 = minps(local_398,auVar77);
    auVar104 = maxps(local_348,auVar77);
    auVar133._0_8_ =
         CONCAT44(auVar77._4_4_ - (float)(~uVar127 & (uint)fVar174) * 0.055555556,
                  auVar77._0_4_ - (float)(~uVar115 & (uint)fVar170) * 0.055555556);
    auVar133._8_4_ = auVar77._8_4_ - (float)(~uVar128 & (uint)fVar176) * 0.055555556;
    auVar133._12_4_ = auVar77._12_4_ - (float)(~uVar129 & (uint)fVar178) * 0.055555556;
    auVar164._0_4_ = (float)(~uVar190 & (uint)fVar166) * 0.055555556 + auVar142._0_4_;
    auVar164._4_4_ = (float)(~uVar194 & (uint)fVar167) * 0.055555556 + auVar142._4_4_;
    auVar164._8_4_ = (float)(~uVar196 & (uint)fVar168) * 0.055555556 + auVar142._8_4_;
    auVar164._12_4_ = (float)(~uVar198 & (uint)fVar169) * 0.055555556 + auVar142._12_4_;
    auVar18._4_4_ = uStack_324;
    auVar18._0_4_ = local_328;
    auVar18._8_4_ = uStack_320;
    auVar18._12_4_ = uStack_31c;
    auVar105 = minps(auVar18,auVar142);
    auVar14._4_4_ = uStack_354;
    auVar14._0_4_ = local_358;
    auVar14._8_4_ = uStack_350;
    auVar14._12_4_ = uStack_34c;
    auVar191 = maxps(auVar14,auVar142);
    auVar143._0_8_ =
         CONCAT44(auVar142._4_4_ - (float)(~uVar127 & (uint)fVar167) * 0.055555556,
                  auVar142._0_4_ - (float)(~uVar115 & (uint)fVar166) * 0.055555556);
    auVar143._8_4_ = auVar142._8_4_ - (float)(~uVar128 & (uint)fVar168) * 0.055555556;
    auVar143._12_4_ = auVar142._12_4_ - (float)(~uVar129 & (uint)fVar169) * 0.055555556;
    auVar179._0_8_ =
         CONCAT44((float)(~uVar194 & (uint)fVar84) * 0.055555556 + auVar86._4_4_,
                  (float)(~uVar190 & (uint)fVar130) * 0.055555556 + auVar86._0_4_);
    auVar179._8_4_ = (float)(~uVar196 & (uint)fVar92) * 0.055555556 + auVar86._8_4_;
    auVar179._12_4_ = (float)(~uVar198 & (uint)fVar161) * 0.055555556 + auVar86._12_4_;
    auVar39._8_4_ = auVar179._8_4_;
    auVar39._0_8_ = auVar179._0_8_;
    auVar39._12_4_ = auVar179._12_4_;
    auVar20._4_4_ = uStack_314;
    auVar20._0_4_ = local_318;
    auVar20._8_4_ = uStack_310;
    auVar20._12_4_ = uStack_30c;
    auVar157 = minps(auVar20,auVar86);
    auVar184 = maxps(local_378,auVar86);
    auVar87._0_8_ =
         CONCAT44(auVar86._4_4_ - (float)(~uVar127 & (uint)fVar84) * 0.055555556,
                  auVar86._0_4_ - (float)(~uVar115 & (uint)fVar130) * 0.055555556);
    auVar87._8_4_ = auVar86._8_4_ - (float)(~uVar128 & (uint)fVar92) * 0.055555556;
    auVar87._12_4_ = auVar86._12_4_ - (float)(~uVar129 & (uint)fVar161) * 0.055555556;
    auVar119._8_4_ = auVar133._8_4_;
    auVar119._0_8_ = auVar133._0_8_;
    auVar119._12_4_ = auVar133._12_4_;
    auVar120 = minps(auVar119,_local_368);
    auVar118 = minps(auVar118,auVar120);
    auVar121._8_4_ = auVar143._8_4_;
    auVar121._0_8_ = auVar143._0_8_;
    auVar121._12_4_ = auVar143._12_4_;
    auVar120 = minps(auVar121,auVar164);
    auVar105 = minps(auVar105,auVar120);
    auVar122._8_4_ = auVar87._8_4_;
    auVar122._0_8_ = auVar87._0_8_;
    auVar122._12_4_ = auVar87._12_4_;
    auVar120 = minps(auVar122,auVar39);
    auVar157 = minps(auVar157,auVar120);
    local_398._4_4_ = local_398._4_4_ & uVar62 | ~uVar62 & auVar118._4_4_;
    local_398._0_4_ = local_398._0_4_ & uVar54 | ~uVar54 & auVar118._0_4_;
    local_398._8_4_ = local_398._8_4_ & uVar63 | ~uVar63 & auVar118._8_4_;
    local_398._12_4_ = local_398._12_4_ & uVar64 | ~uVar64 & auVar118._12_4_;
    local_328 = local_328 & uVar54 | ~uVar54 & auVar105._0_4_;
    uStack_324 = uStack_324 & uVar62 | ~uVar62 & auVar105._4_4_;
    uStack_320 = uStack_320 & uVar63 | ~uVar63 & auVar105._8_4_;
    uStack_31c = uStack_31c & uVar64 | ~uVar64 & auVar105._12_4_;
    local_318 = local_318 & uVar54 | ~uVar54 & auVar157._0_4_;
    uStack_314 = uStack_314 & uVar62 | ~uVar62 & auVar157._4_4_;
    uStack_310 = uStack_310 & uVar63 | ~uVar63 & auVar157._8_4_;
    uStack_30c = uStack_30c & uVar64 | ~uVar64 & auVar157._12_4_;
    auVar118 = maxps(auVar133,_local_368);
    auVar118 = maxps(auVar104,auVar118);
    auVar157 = maxps(auVar143,auVar164);
    auVar104 = maxps(auVar191,auVar157);
    auVar157 = maxps(auVar87,auVar179);
    auVar157 = maxps(auVar184,auVar157);
    auVar40._0_4_ = ~uVar54 & auVar118._0_4_;
    auVar40._4_4_ = ~uVar62 & auVar118._4_4_;
    auVar40._8_4_ = ~uVar63 & auVar118._8_4_;
    auVar40._12_4_ = ~uVar64 & auVar118._12_4_;
    auVar172._0_4_ = local_348._0_4_ & uVar54;
    auVar172._4_4_ = local_348._4_4_ & uVar62;
    auVar172._8_4_ = local_348._8_4_ & uVar63;
    auVar172._12_4_ = local_348._12_4_ & uVar64;
    local_348 = auVar172 | auVar40;
    local_358 = local_358 & uVar54 | ~uVar54 & auVar104._0_4_;
    uStack_354 = uStack_354 & uVar62 | ~uVar62 & auVar104._4_4_;
    uStack_350 = uStack_350 & uVar63 | ~uVar63 & auVar104._8_4_;
    uStack_34c = uStack_34c & uVar64 | ~uVar64 & auVar104._12_4_;
    local_378._4_4_ = local_378._4_4_ & uVar62 | ~uVar62 & auVar157._4_4_;
    local_378._0_4_ = uVar73 & uVar54 | ~uVar54 & auVar157._0_4_;
    local_378._8_4_ = uVar181 & uVar63 | ~uVar63 & auVar157._8_4_;
    local_378._12_4_ = uVar182 & uVar64 | ~uVar64 & auVar157._12_4_;
    uVar30 = uVar30 + 4;
  }
  fVar189 = fVar189 + fVar99;
  fVar193 = fVar193 + fVar111;
  fVar195 = fVar195 + fVar113;
  fVar183 = fVar183 + fVar155;
  fVar186 = fVar186 + fVar160;
  fVar187 = fVar187 + fVar162;
  fVar74 = (fVar148 + fVar137) * 0.33333334 + fVar189;
  fVar93 = (fVar152 + fVar145) * 0.33333334 + fVar193;
  fVar97 = (fVar140 + fVar149) * 0.33333334 + fVar195;
  fVar155 = fVar183 - (fVar83 + fVar101) * 0.33333334;
  fVar114 = fVar186 - (fVar114 + fVar154) * 0.33333334;
  fVar160 = fVar187 - (fVar91 + fVar159) * 0.33333334;
  auVar41._4_4_ = local_398._0_4_;
  auVar41._0_4_ = local_398._4_4_;
  auVar41._8_4_ = local_398._12_4_;
  auVar41._12_4_ = local_398._8_4_;
  auVar118 = minps(auVar41,local_398);
  auVar56._0_8_ = auVar118._8_8_;
  auVar56._8_4_ = auVar118._0_4_;
  auVar56._12_4_ = auVar118._4_4_;
  auVar104 = minps(auVar56,auVar118);
  auVar19._4_4_ = uStack_324;
  auVar19._0_4_ = local_328;
  auVar19._8_4_ = uStack_320;
  auVar19._12_4_ = uStack_31c;
  auVar42._4_4_ = local_328;
  auVar42._0_4_ = uStack_324;
  auVar42._8_4_ = uStack_31c;
  auVar42._12_4_ = uStack_320;
  auVar118 = minps(auVar42,auVar19);
  auVar106._0_8_ = auVar118._8_8_;
  auVar106._8_4_ = auVar118._0_4_;
  auVar106._12_4_ = auVar118._4_4_;
  auVar118 = minps(auVar106,auVar118);
  auVar21._4_4_ = uStack_314;
  auVar21._0_4_ = local_318;
  auVar21._8_4_ = uStack_310;
  auVar21._12_4_ = uStack_30c;
  auVar43._4_4_ = local_318;
  auVar43._0_4_ = uStack_314;
  auVar43._8_4_ = uStack_30c;
  auVar43._12_4_ = uStack_310;
  auVar157 = minps(auVar43,auVar21);
  auVar44._0_8_ = auVar157._8_8_;
  auVar44._8_4_ = auVar157._0_4_;
  auVar44._12_4_ = auVar157._4_4_;
  auVar80._4_4_ = auVar118._0_4_;
  auVar80._0_4_ = auVar104._0_4_;
  auVar45._4_4_ = local_348._0_4_;
  auVar45._0_4_ = local_348._4_4_;
  auVar45._8_4_ = local_348._12_4_;
  auVar45._12_4_ = local_348._8_4_;
  auVar118 = maxps(auVar45,local_348);
  auVar57._0_8_ = auVar118._8_8_;
  auVar57._8_4_ = auVar118._0_4_;
  auVar57._12_4_ = auVar118._4_4_;
  auVar104 = maxps(auVar57,auVar118);
  auVar15._4_4_ = uStack_354;
  auVar15._0_4_ = local_358;
  auVar15._8_4_ = uStack_350;
  auVar15._12_4_ = uStack_34c;
  auVar46._4_4_ = local_358;
  auVar46._0_4_ = uStack_354;
  auVar46._8_4_ = uStack_34c;
  auVar46._12_4_ = uStack_350;
  auVar118 = maxps(auVar46,auVar15);
  auVar107._0_8_ = auVar118._8_8_;
  auVar107._8_4_ = auVar118._0_4_;
  auVar107._12_4_ = auVar118._4_4_;
  auVar118 = maxps(auVar107,auVar118);
  auVar134._4_4_ = uVar73;
  auVar134._0_4_ = local_378._4_4_;
  auVar134._8_4_ = uVar182;
  auVar134._12_4_ = uVar181;
  auVar105 = maxps(auVar134,local_378);
  auVar135._0_8_ = auVar105._8_8_;
  auVar135._8_4_ = auVar105._0_4_;
  auVar135._12_4_ = auVar105._4_4_;
  auVar88._4_4_ = auVar118._0_4_;
  auVar88._0_4_ = auVar104._0_4_;
  uVar30 = 0;
  _local_368 = _DAT_01f45a40;
  local_3a8._8_8_ = 0x7f8000007f800000;
  local_3a8._0_8_ = 0x7f8000007f800000;
  local_358 = 0x7f800000;
  uStack_354 = 0x7f800000;
  uStack_350 = 0x7f800000;
  uStack_34c = 0x7f800000;
  local_378._8_8_ = 0x7f8000007f800000;
  local_378._0_8_ = 0x7f8000007f800000;
  auVar109 = _DAT_01f45a40;
  auVar118 = _DAT_01f45a40;
  while( true ) {
    uVar198 = local_368._0_4_;
    uVar54 = local_368._8_4_;
    uVar62 = local_368._12_4_;
    uVar73 = local_378._0_4_;
    uVar181 = local_378._8_4_;
    uVar182 = local_378._12_4_;
    if (7 < uVar30) break;
    uVar63 = (uint)uVar30;
    uVar64 = -(uint)(-0x7ffffff9 < (int)(uVar63 ^ 0x80000000));
    uVar115 = -(uint)(-0x7ffffff9 < (int)(uVar63 ^ 0x80000000));
    uVar127 = -(uint)(-0x7ffffff9 < (int)(uVar63 ^ 0x80000000));
    uVar128 = -(uint)(-0x7ffffff9 < (int)(uVar63 ^ 0x80000000));
    lVar32 = uVar30 * 4;
    fVar162 = *(float *)(bezier_basis0 + lVar32 + 0x1dc);
    fVar83 = *(float *)(bezier_basis0 + lVar32 + 0x1e0);
    fVar91 = *(float *)(bezier_basis0 + lVar32 + 0x1e4);
    fVar95 = *(float *)(bezier_basis0 + lVar32 + 0x1e8);
    lVar32 = uVar30 * 4;
    fVar99 = *(float *)(bezier_basis0 + lVar32 + 0x660);
    fVar100 = *(float *)(bezier_basis0 + lVar32 + 0x664);
    fVar111 = *(float *)(bezier_basis0 + lVar32 + 0x668);
    fVar112 = *(float *)(bezier_basis0 + lVar32 + 0x66c);
    lVar32 = uVar30 * 4;
    fVar113 = *(float *)(bezier_basis0 + lVar32 + 0xae4);
    fVar130 = *(float *)(bezier_basis0 + lVar32 + 0xae8);
    fVar148 = *(float *)(bezier_basis0 + lVar32 + 0xaec);
    fVar152 = *(float *)(bezier_basis0 + lVar32 + 0xaf0);
    lVar32 = uVar30 * 4;
    fVar101 = *(float *)(bezier_basis0 + lVar32 + 0xf68);
    fVar140 = *(float *)(bezier_basis0 + lVar32 + 0xf6c);
    fVar141 = *(float *)(bezier_basis0 + lVar32 + 0xf70);
    fVar156 = *(float *)(bezier_basis0 + lVar32 + 0xf74);
    auVar78._0_4_ = fVar189 * fVar162 + fVar74 * fVar99 + fVar155 * fVar113 + fVar183 * fVar101;
    auVar78._4_4_ = fVar189 * fVar83 + fVar74 * fVar100 + fVar155 * fVar130 + fVar183 * fVar140;
    auVar78._8_4_ = fVar189 * fVar91 + fVar74 * fVar111 + fVar155 * fVar148 + fVar183 * fVar141;
    auVar78._12_4_ = fVar189 * fVar95 + fVar74 * fVar112 + fVar155 * fVar152 + fVar183 * fVar156;
    auVar66._0_4_ = fVar193 * fVar162 + fVar93 * fVar99 + fVar114 * fVar113 + fVar186 * fVar101;
    auVar66._4_4_ = fVar193 * fVar83 + fVar93 * fVar100 + fVar114 * fVar130 + fVar186 * fVar140;
    auVar66._8_4_ = fVar193 * fVar91 + fVar93 * fVar111 + fVar114 * fVar148 + fVar186 * fVar141;
    auVar66._12_4_ = fVar193 * fVar95 + fVar93 * fVar112 + fVar114 * fVar152 + fVar186 * fVar156;
    local_138._0_4_ = fVar162 * fVar195 + fVar99 * fVar97 + fVar113 * fVar160 + fVar101 * fVar187;
    local_138._4_4_ = fVar83 * fVar195 + fVar100 * fVar97 + fVar130 * fVar160 + fVar140 * fVar187;
    fStack_130 = fVar91 * fVar195 + fVar111 * fVar97 + fVar148 * fVar160 + fVar141 * fVar187;
    fStack_12c = fVar95 * fVar195 + fVar112 * fVar97 + fVar152 * fVar160 + fVar156 * fVar187;
    lVar32 = uVar30 * 4;
    fVar162 = *(float *)(bezier_basis0 + lVar32 + 0x13ec);
    fVar83 = *(float *)(bezier_basis0 + lVar32 + 0x13f0);
    fVar91 = *(float *)(bezier_basis0 + lVar32 + 0x13f4);
    fVar95 = *(float *)(bezier_basis0 + lVar32 + 0x13f8);
    lVar32 = uVar30 * 4;
    fVar99 = *(float *)(bezier_basis0 + lVar32 + 0x1870);
    fVar100 = *(float *)(bezier_basis0 + lVar32 + 0x1874);
    fVar111 = *(float *)(bezier_basis0 + lVar32 + 0x1878);
    fVar112 = *(float *)(bezier_basis0 + lVar32 + 0x187c);
    lVar32 = uVar30 * 4;
    fVar113 = *(float *)(bezier_basis0 + lVar32 + 0x1cf4);
    fVar130 = *(float *)(bezier_basis0 + lVar32 + 0x1cf8);
    fVar148 = *(float *)(bezier_basis0 + lVar32 + 0x1cfc);
    fVar152 = *(float *)(bezier_basis0 + lVar32 + 0x1d00);
    lVar32 = uVar30 * 4;
    fVar101 = *(float *)(bezier_basis0 + lVar32 + 0x2178);
    fVar140 = *(float *)(bezier_basis0 + lVar32 + 0x217c);
    fVar141 = *(float *)(bezier_basis0 + lVar32 + 0x2180);
    fVar156 = *(float *)(bezier_basis0 + lVar32 + 0x2184);
    fVar84 = fVar189 * fVar162 + fVar74 * fVar99 + fVar155 * fVar113 + fVar183 * fVar101;
    fVar92 = fVar189 * fVar83 + fVar74 * fVar100 + fVar155 * fVar130 + fVar183 * fVar140;
    fVar96 = fVar189 * fVar91 + fVar74 * fVar111 + fVar155 * fVar148 + fVar183 * fVar141;
    fVar154 = fVar189 * fVar95 + fVar74 * fVar112 + fVar155 * fVar152 + fVar183 * fVar156;
    fVar137 = fVar193 * fVar162 + fVar93 * fVar99 + fVar114 * fVar113 + fVar186 * fVar101;
    fVar145 = fVar193 * fVar83 + fVar93 * fVar100 + fVar114 * fVar130 + fVar186 * fVar140;
    fVar149 = fVar193 * fVar91 + fVar93 * fVar111 + fVar114 * fVar148 + fVar186 * fVar141;
    fVar153 = fVar193 * fVar95 + fVar93 * fVar112 + fVar114 * fVar152 + fVar186 * fVar156;
    fVar162 = fVar162 * fVar195 + fVar99 * fVar97 + fVar113 * fVar160 + fVar101 * fVar187;
    fVar83 = fVar83 * fVar195 + fVar100 * fVar97 + fVar130 * fVar160 + fVar140 * fVar187;
    fVar91 = fVar91 * fVar195 + fVar111 * fVar97 + fVar148 * fVar160 + fVar141 * fVar187;
    fVar95 = fVar95 * fVar195 + fVar112 * fVar97 + fVar152 * fVar160 + fVar156 * fVar187;
    uVar129 = -(uint)(uVar63 == 0);
    uVar190 = -(uint)(uVar63 == 1);
    uVar194 = -(uint)(uVar63 == 2);
    uVar196 = -(uint)(uVar63 == 3);
    uVar171 = -(uint)(uVar63 == 7);
    uVar175 = -(uint)(uVar63 == 6);
    uVar177 = -(uint)(uVar63 == 5);
    uVar63 = -(uint)(uVar63 == 4);
    auVar47._0_4_ = (float)(~uVar171 & (uint)fVar84) * 0.055555556 + auVar78._0_4_;
    auVar47._4_4_ = (float)(~uVar175 & (uint)fVar92) * 0.055555556 + auVar78._4_4_;
    auVar47._8_4_ = (float)(~uVar177 & (uint)fVar96) * 0.055555556 + auVar78._8_4_;
    auVar47._12_4_ = (float)(~uVar63 & (uint)fVar154) * 0.055555556 + auVar78._12_4_;
    auVar180 = minps(local_3a8,auVar78);
    auVar120 = maxps(_local_368,auVar78);
    auVar185._0_8_ =
         CONCAT44(auVar78._4_4_ - (float)(~uVar190 & (uint)fVar92) * 0.055555556,
                  auVar78._0_4_ - (float)(~uVar129 & (uint)fVar84) * 0.055555556);
    auVar185._8_4_ = auVar78._8_4_ - (float)(~uVar194 & (uint)fVar96) * 0.055555556;
    auVar185._12_4_ = auVar78._12_4_ - (float)(~uVar196 & (uint)fVar154) * 0.055555556;
    auVar79._0_4_ = (float)(~uVar171 & (uint)fVar137) * 0.055555556 + auVar66._0_4_;
    auVar79._4_4_ = (float)(~uVar175 & (uint)fVar145) * 0.055555556 + auVar66._4_4_;
    auVar79._8_4_ = (float)(~uVar177 & (uint)fVar149) * 0.055555556 + auVar66._8_4_;
    auVar79._12_4_ = (float)(~uVar63 & (uint)fVar153) * 0.055555556 + auVar66._12_4_;
    auVar16._4_4_ = uStack_354;
    auVar16._0_4_ = local_358;
    auVar16._8_4_ = uStack_350;
    auVar16._12_4_ = uStack_34c;
    auVar104 = minps(auVar16,auVar66);
    auVar165 = maxps(auVar118,auVar66);
    auVar67._0_8_ =
         CONCAT44(auVar66._4_4_ - (float)(~uVar190 & (uint)fVar145) * 0.055555556,
                  auVar66._0_4_ - (float)(~uVar129 & (uint)fVar137) * 0.055555556);
    auVar67._8_4_ = auVar66._8_4_ - (float)(~uVar194 & (uint)fVar149) * 0.055555556;
    auVar67._12_4_ = auVar66._12_4_ - (float)(~uVar196 & (uint)fVar153) * 0.055555556;
    auVar173._0_4_ = (float)(~uVar171 & (uint)fVar162) * 0.055555556 + (float)local_138._0_4_;
    auVar173._4_4_ = (float)(~uVar175 & (uint)fVar83) * 0.055555556 + (float)local_138._4_4_;
    auVar173._8_4_ = (float)(~uVar177 & (uint)fVar91) * 0.055555556 + fStack_130;
    auVar173._12_4_ = (float)(~uVar63 & (uint)fVar95) * 0.055555556 + fStack_12c;
    auVar191 = minps(local_378,_local_138);
    auVar144 = maxps(auVar109,_local_138);
    auVar192._0_8_ =
         CONCAT44((float)local_138._4_4_ - (float)(~uVar190 & (uint)fVar83) * 0.055555556,
                  (float)local_138._0_4_ - (float)(~uVar129 & (uint)fVar162) * 0.055555556);
    auVar192._8_4_ = fStack_130 - (float)(~uVar194 & (uint)fVar91) * 0.055555556;
    auVar192._12_4_ = fStack_12c - (float)(~uVar196 & (uint)fVar95) * 0.055555556;
    auVar123._8_4_ = auVar185._8_4_;
    auVar123._0_8_ = auVar185._0_8_;
    auVar123._12_4_ = auVar185._12_4_;
    auVar184 = minps(auVar123,auVar47);
    auVar180 = minps(auVar180,auVar184);
    auVar124._8_4_ = auVar67._8_4_;
    auVar124._0_8_ = auVar67._0_8_;
    auVar124._12_4_ = auVar67._12_4_;
    auVar184 = minps(auVar124,auVar79);
    auVar104 = minps(auVar104,auVar184);
    auVar125._8_4_ = auVar192._8_4_;
    auVar125._0_8_ = auVar192._0_8_;
    auVar125._12_4_ = auVar192._12_4_;
    auVar184 = minps(auVar125,auVar173);
    auVar184 = minps(auVar191,auVar184);
    local_3a8._4_4_ = local_3a8._4_4_ & uVar115 | ~uVar115 & auVar180._4_4_;
    local_3a8._0_4_ = local_3a8._0_4_ & uVar64 | ~uVar64 & auVar180._0_4_;
    local_3a8._8_4_ = local_3a8._8_4_ & uVar127 | ~uVar127 & auVar180._8_4_;
    local_3a8._12_4_ = local_3a8._12_4_ & uVar128 | ~uVar128 & auVar180._12_4_;
    local_358 = local_358 & uVar64 | ~uVar64 & auVar104._0_4_;
    uStack_354 = uStack_354 & uVar115 | ~uVar115 & auVar104._4_4_;
    uStack_350 = uStack_350 & uVar127 | ~uVar127 & auVar104._8_4_;
    uStack_34c = uStack_34c & uVar128 | ~uVar128 & auVar104._12_4_;
    local_378._4_4_ = local_378._4_4_ & uVar115 | ~uVar115 & auVar184._4_4_;
    local_378._0_4_ = uVar73 & uVar64 | ~uVar64 & auVar184._0_4_;
    local_378._8_4_ = uVar181 & uVar127 | ~uVar127 & auVar184._8_4_;
    local_378._12_4_ = uVar182 & uVar128 | ~uVar128 & auVar184._12_4_;
    auVar104 = maxps(auVar185,auVar47);
    auVar104 = maxps(auVar120,auVar104);
    auVar120 = maxps(auVar67,auVar79);
    auVar184 = maxps(auVar165,auVar120);
    auVar120 = maxps(auVar192,auVar173);
    auVar120 = maxps(auVar144,auVar120);
    local_368._4_4_ = local_368._4_4_ & uVar115 | ~uVar115 & auVar104._4_4_;
    local_368._0_4_ = uVar198 & uVar64 | ~uVar64 & auVar104._0_4_;
    fStack_360 = (float)(uVar54 & uVar127 | ~uVar127 & auVar104._8_4_);
    fStack_35c = (float)(uVar62 & uVar128 | ~uVar128 & auVar104._12_4_);
    auVar68._0_4_ = ~uVar64 & auVar184._0_4_;
    auVar68._4_4_ = ~uVar115 & auVar184._4_4_;
    auVar68._8_4_ = ~uVar127 & auVar184._8_4_;
    auVar68._12_4_ = ~uVar128 & auVar184._12_4_;
    auVar158._0_4_ = auVar118._0_4_ & uVar64;
    auVar158._4_4_ = auVar118._4_4_ & uVar115;
    auVar158._8_4_ = auVar118._8_4_ & uVar127;
    auVar158._12_4_ = auVar118._12_4_ & uVar128;
    auVar118 = auVar158 | auVar68;
    auVar108._0_4_ = auVar109._0_4_ & uVar64;
    auVar108._4_4_ = auVar109._4_4_ & uVar115;
    auVar108._8_4_ = auVar109._8_4_ & uVar127;
    auVar108._12_4_ = auVar109._12_4_ & uVar128;
    auVar109._0_4_ = ~uVar64 & auVar120._0_4_;
    auVar109._4_4_ = ~uVar115 & auVar120._4_4_;
    auVar109._8_4_ = ~uVar127 & auVar120._8_4_;
    auVar109._12_4_ = ~uVar128 & auVar120._12_4_;
    auVar109 = auVar108 | auVar109;
    uVar30 = uVar30 + 4;
  }
  auVar157 = minps(auVar44,auVar157);
  auVar80._8_4_ = auVar157._0_4_;
  auVar80._12_4_ = 0;
  auVar157 = maxps(auVar135,auVar105);
  auVar88._8_4_ = auVar157._0_4_;
  auVar88._12_4_ = 0;
  auVar48._4_4_ = local_3a8._0_4_;
  auVar48._0_4_ = local_3a8._4_4_;
  auVar48._8_4_ = local_3a8._12_4_;
  auVar48._12_4_ = local_3a8._8_4_;
  auVar157 = minps(auVar48,local_3a8);
  auVar58._0_8_ = auVar157._8_8_;
  auVar58._8_4_ = auVar157._0_4_;
  auVar58._12_4_ = auVar157._4_4_;
  auVar104 = minps(auVar58,auVar157);
  auVar17._4_4_ = uStack_354;
  auVar17._0_4_ = local_358;
  auVar17._8_4_ = uStack_350;
  auVar17._12_4_ = uStack_34c;
  auVar49._4_4_ = local_358;
  auVar49._0_4_ = uStack_354;
  auVar49._8_4_ = uStack_34c;
  auVar49._12_4_ = uStack_350;
  auVar157 = minps(auVar49,auVar17);
  auVar69._0_8_ = auVar157._8_8_;
  auVar69._8_4_ = auVar157._0_4_;
  auVar69._12_4_ = auVar157._4_4_;
  auVar105 = minps(auVar69,auVar157);
  auVar50._4_4_ = uVar73;
  auVar50._0_4_ = local_378._4_4_;
  auVar50._8_4_ = uVar182;
  auVar50._12_4_ = uVar181;
  auVar157 = minps(auVar50,local_378);
  auVar59._0_8_ = auVar157._8_8_;
  auVar59._8_4_ = auVar157._0_4_;
  auVar59._12_4_ = auVar157._4_4_;
  auVar157 = minps(auVar59,auVar157);
  auVar70._4_4_ = auVar105._0_4_;
  auVar70._0_4_ = auVar104._0_4_;
  auVar70._8_4_ = auVar157._0_4_;
  auVar70._12_4_ = 0;
  auVar105 = minps(auVar80,auVar70);
  auVar51._4_4_ = uVar198;
  auVar51._0_4_ = local_368._4_4_;
  auVar51._8_4_ = uVar62;
  auVar51._12_4_ = uVar54;
  auVar157 = maxps(auVar51,_local_368);
  auVar60._0_8_ = auVar157._8_8_;
  auVar60._8_4_ = auVar157._0_4_;
  auVar60._12_4_ = auVar157._4_4_;
  auVar157 = maxps(auVar60,auVar157);
  auVar52._4_4_ = auVar118._0_4_;
  auVar52._0_4_ = auVar118._4_4_;
  auVar52._8_4_ = auVar118._12_4_;
  auVar52._12_4_ = auVar118._8_4_;
  auVar118 = maxps(auVar52,auVar118);
  auVar71._0_8_ = auVar118._8_8_;
  auVar71._8_4_ = auVar118._0_4_;
  auVar71._12_4_ = auVar118._4_4_;
  auVar104 = maxps(auVar71,auVar118);
  auVar53._4_4_ = auVar109._0_4_;
  auVar53._0_4_ = auVar109._4_4_;
  auVar53._8_4_ = auVar109._12_4_;
  auVar53._12_4_ = auVar109._8_4_;
  auVar118 = maxps(auVar53,auVar109);
  auVar61._0_8_ = auVar118._8_8_;
  auVar61._8_4_ = auVar118._0_4_;
  auVar61._12_4_ = auVar118._4_4_;
  auVar118 = maxps(auVar61,auVar118);
  auVar72._4_4_ = auVar104._0_4_;
  auVar72._0_4_ = auVar157._0_4_;
  auVar72._8_4_ = auVar118._0_4_;
  auVar72._12_4_ = 0;
  auVar118 = maxps(auVar88,auVar72);
  auVar89._0_4_ = -(uint)(auVar118._0_4_ < 1.844e+18 && fVar81 < auVar105._0_4_);
  auVar89._4_4_ = -(uint)(auVar118._4_4_ < 1.844e+18 && fVar82 < auVar105._4_4_);
  auVar89._8_4_ = -(uint)(auVar118._8_4_ < 1.844e+18 && fVar94 < auVar105._8_4_);
  auVar89._12_4_ = -(uint)(auVar118._12_4_ < 1.844e+18 && fVar98 < auVar105._12_4_);
  uVar28 = movmskps((int)lVar31,auVar89);
  pBVar29 = (BufferView<embree::Vec3fa> *)(ulong)CONCAT31((int3)((uint)uVar28 >> 8),~(byte)uVar28);
  uVar23 = uVar23 + 1;
  if ((~(byte)uVar28 & 7) != 0) goto LAB_00200326;
  goto LAB_001ff308;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }